

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O0

void __thiscall TPZFront<float>::STensorProductMTData::WorkDone(STensorProductMTData *this)

{
  int iVar1;
  mutex_type *in_RDI;
  TPZSemaphore *unaff_retaddr;
  scoped_lock<std::mutex> lck;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  in_RDI[2].super___mutex_base._M_mutex.__data.__kind =
       in_RDI[2].super___mutex_base._M_mutex.__data.__kind + 1;
  iVar2 = in_RDI[2].super___mutex_base._M_mutex.__data.__kind;
  iVar1 = NThreads((STensorProductMTData *)0x1cc6229);
  if (iVar2 == iVar1) {
    TPZSemaphore::Post(unaff_retaddr);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1cc6264);
  return;
}

Assistant:

void WorkDone(){
			std::scoped_lock<std::mutex> lck(fMutexWorkDoneCS);
      
			fWorkDoneCount++;
			if(fWorkDoneCount == NThreads()){
        fWorkDoneSem.Post();
			}
		}